

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall
ON_PolyCurve::GetNextDiscontinuity
          (ON_PolyCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  long lVar1;
  uint uVar2;
  ON_Object *p;
  ON_Object *p_00;
  undefined1 auVar3 [16];
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  continuity cVar7;
  uint uVar8;
  double *pdVar9;
  ON_ArcCurve *pOVar10;
  ON_ArcCurve *pOVar11;
  double *knot;
  int iVar12;
  long lVar13;
  int iVar14;
  ON_Curve *seg1;
  ON_Object *this_00;
  uint uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar18;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int curve_hint;
  double s;
  ON_Interval sdom;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dVector Tm;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  undefined4 local_218;
  double local_200;
  continuity local_1f4;
  ON_Interval local_1f0;
  long local_1e0;
  ulong local_1d8;
  ON_3dVector local_1d0;
  undefined1 local_1b8 [16];
  ON_Interval local_1a0;
  long local_190;
  ON_3dVector local_188;
  ON_3dVector local_170;
  ON_3dVector local_158;
  ON_3dVector local_138;
  ON_3dVector local_120;
  double local_108;
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  undefined8 uStack_d0;
  ON_3dVector local_c8;
  undefined1 local_a8 [16];
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  auVar3._8_4_ = in_XMM0_Dc;
  auVar3._0_8_ = t0;
  auVar3._12_4_ = in_XMM0_Dd;
  uVar19 = auVar3._8_8_;
  ON_Interval::ON_Interval(&local_1a0);
  ON_Interval::ON_Interval(&local_1f0);
  uVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  bVar6 = 0;
  uVar15 = 0;
  if (t0 == t1 || (int)uVar2 < 1) goto LAB_00592a09;
  cVar7 = ON::ParametricContinuity(c);
  if (hint != (int *)0x0) {
    uVar15 = *hint & 0x3fff;
  }
  if ((this->m_t).m_count < 1) {
    pdVar9 = (double *)0x0;
  }
  else {
    pdVar9 = (this->m_t).m_a;
  }
  uVar8 = ON_NurbsSpanIndex(2,uVar2 + 1,pdVar9,t0,((t0 <= t1) - 1) + (uint)(t0 <= t1),uVar15);
  iVar12 = 0;
  if ((hint != (int *)0x0) && (iVar12 = 0, uVar15 == uVar8)) {
    iVar12 = *hint >> 0xe;
  }
  pdVar9 = (this->m_t).m_a;
  dVar21 = pdVar9[(int)uVar8];
  dVar18 = pdVar9[(long)(int)uVar8 + 1];
  dVar20 = (ABS(dVar18 - dVar21) + ABS(dVar18) + ABS(dVar21)) * 1.490116119385e-08;
  local_1f4 = c;
  if (dVar21 + dVar20 < dVar18 - dVar20) {
    if (t1 <= t0) {
      if ((((dVar21 < t0) && (t1 < dVar21)) && (0 < (int)uVar8)) && (ABS(t0 - dVar21) <= dVar20)) {
        uVar19 = 0;
        t0 = dVar21;
      }
    }
    else if (((t0 < dVar18) && (dVar18 < t1)) &&
            (((int)(uVar8 + 1) < (int)uVar2 && (ABS(t0 - dVar18) <= dVar20)))) {
      knot = (double *)0x0;
      if (0 < (this->m_t).m_count) {
        knot = pdVar9;
      }
      uVar8 = ON_NurbsSpanIndex(2,uVar2 + 1,knot,dVar18,1,uVar15);
      uVar19 = 0;
      t0 = dVar18;
    }
  }
  if (uVar8 < uVar2) {
    dVar21 = t1;
    if (t0 <= t1) {
      dVar21 = t0;
    }
    lVar13 = (long)(int)uVar8;
    pdVar9 = (this->m_t).m_a;
    if (pdVar9[lVar13 + 1] <= dVar21) goto LAB_005929c0;
    uVar15 = (uint)(t0 <= t1) * 2 - 1;
    local_d8 = t0;
    if (t0 <= t1) {
      local_d8 = t1;
    }
    local_f8 = (ABS(t0 - t1) + ABS(t1) + ABS(t0)) * 2.3283064365386963e-10;
    dVar18 = dVar21 + local_f8;
    local_e8._8_4_ = in_XMM1_Dc;
    local_e8._0_8_ = dVar18;
    local_e8._12_4_ = in_XMM1_Dd;
    local_f8 = local_d8 - local_f8;
    local_190 = (long)(int)uVar15;
    local_1e0 = local_190 * 8;
    local_1d8 = (ulong)uVar15;
    uVar15 = 0;
    uStack_f0 = uVar19;
    uStack_d0 = uVar19;
    while ((pdVar9[lVar13] <= local_d8 && local_d8 != pdVar9[lVar13] &&
           (p = (ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar13],
           p != (ON_Object *)0x0))) {
      (*p->_vptr_ON_Object[0x25])(p);
      pdVar9 = (this->m_t).m_a;
      local_1f0.m_t[1] = dVar18;
      ON_Interval::Set(&local_1a0,pdVar9[lVar13],pdVar9[lVar13 + 1]);
      dVar20 = ON_Interval::TransformParameterTo(&local_1a0,&local_1f0,t0);
      dVar18 = ON_Interval::TransformParameterTo(&local_1a0,&local_1f0,t1);
      uVar16 = SUB84(dVar18,0);
      uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
      local_218 = SUB84(dVar20,0);
      local_1b8._8_4_ = extraout_XMM0_Dc;
      local_1b8._0_8_ = dVar18;
      local_1b8._12_4_ = extraout_XMM0_Dd;
      uVar15 = (*p->_vptr_ON_Object[0x36])
                         (local_218,uVar16,cos_angle_tolerance,curvature_tolerance,p,(ulong)cVar7,
                          &local_200);
      dVar18 = (double)CONCAT44(uVar17,uVar16);
      uVar8 = (uint)lVar13;
      if ((char)uVar15 != '\0') {
        bVar4 = ON_Interval::operator==(&local_1a0,&local_1f0);
        dVar22 = local_200;
        if (bVar4) {
LAB_005920ba:
          dVar18 = (double)CONCAT44(uVar17,uVar16);
        }
        else {
          dVar22 = ON_Interval::TransformParameterTo(&local_1f0,&local_1a0,local_200);
          if (((double)local_e8._0_8_ < dVar22) && (dVar22 < local_f8)) goto LAB_005920ba;
          local_108 = dVar22;
          dVar18 = ON_Interval::Length(&local_1a0);
          local_a8._8_4_ = extraout_XMM0_Dc_00;
          local_a8._0_8_ = dVar18;
          local_a8._12_4_ = extraout_XMM0_Dd_00;
          dVar18 = ON_Interval::Length(&local_1f0);
          dVar18 = ABS((double)local_a8._0_8_ / dVar18);
          dVar22 = 1.0;
          if ((1.0 <= dVar18) && (dVar22 = dVar18, 1000.0 < dVar18)) {
            dVar22 = 1000.0;
          }
          dVar22 = (ABS(dVar20 - (double)local_1b8._0_8_) +
                   ABS((double)local_1b8._0_8_) + ABS(dVar20)) * 2.3283064365386963e-10 * dVar22;
          dVar18 = (double)local_1b8._0_8_;
          if (local_108 <= (double)local_e8._0_8_) {
            if (dVar20 <= (double)local_1b8._0_8_) {
              dVar20 = dVar20 + dVar22;
            }
            else {
              dVar18 = (double)local_1b8._0_8_ + dVar22;
            }
          }
          uVar16 = SUB84(dVar20,0);
          if (local_f8 <= local_108) {
            if (dVar20 <= dVar18) {
              dVar18 = dVar18 - dVar22;
            }
            else {
              uVar16 = SUB84(dVar20 - dVar22,0);
            }
          }
          uVar15 = (*p->_vptr_ON_Object[0x36])
                             (uVar16,SUB84(dVar18,0),cos_angle_tolerance,curvature_tolerance,p,
                              (ulong)cVar7,&local_200);
          dVar22 = local_108;
          if ((byte)uVar15 != 0) {
            dVar22 = ON_Interval::TransformParameterTo(&local_1f0,&local_1a0,local_200);
            dVar18 = (double)-(ulong)(dVar22 < local_d8 && dVar21 < dVar22);
            uVar15 = (uint)(byte)((byte)uVar15 & SUB81(dVar18,0));
          }
        }
        if (((t != (double *)0x0) && ((char)uVar15 != '\0')) && (*t = dVar22, hint != (int *)0x0)) {
          *hint = uVar8 | iVar12 << 0xe;
        }
        if ((char)uVar15 != '\0') break;
      }
      if (((int)local_1d8 + uVar8 < uVar2) &&
         (p_00 = *(ON_Object **)
                  ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a +
                  lVar13 * 8 + local_1e0), dVar18 = t0, p_00 != (ON_Object *)0x0)) {
        if (t1 < t0) {
          pdVar9 = ON_Interval::operator[](&local_1a0,0);
          if (t1 < *pdVar9) goto LAB_0059233f;
        }
        else {
          pdVar9 = ON_Interval::operator[](&local_1a0,1);
          dVar18 = t1;
          if (*pdVar9 < t1) {
LAB_0059233f:
            if (t1 < t0) {
              dVar20 = t0;
              pdVar9 = ON_Interval::operator[](&local_1f0,0);
              dVar18 = *pdVar9;
              (*p_00->_vptr_ON_Object[0x25])(p_00);
              local_1d0.y = dVar20;
              iVar14 = 1;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_1d0,1);
              uVar16 = SUB84(*pdVar9,0);
              uVar17 = (undefined4)((ulong)*pdVar9 >> 0x20);
            }
            else {
              dVar20 = t0;
              pdVar9 = ON_Interval::operator[](&local_1f0,1);
              dVar18 = *pdVar9;
              (*p_00->_vptr_ON_Object[0x25])(p_00);
              local_1d0.y = dVar20;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)&local_1d0,0);
              uVar16 = SUB84(*pdVar9,0);
              uVar17 = (undefined4)((ulong)*pdVar9 >> 0x20);
              iVar14 = -1;
            }
            auVar3 = local_1b8;
            if (Gsmooth_continuous < cVar7) goto LAB_00592905;
            local_1b8._4_4_ = uVar17;
            local_1b8._0_4_ = uVar16;
            local_1b8._8_8_ = auVar3._8_8_;
            if ((0x1028U >> (cVar7 & 0x1f) & 1) == 0) {
              if ((0x14U >> (cVar7 & 0x1f) & 1) != 0) {
                ON_Curve::Ev1Der((ON_Curve *)p,dVar18,&local_48,&local_170,iVar14,(int *)0x0);
                ON_Curve::Ev1Der((ON_Curve *)p_00,(double)local_1b8._0_8_,&local_60,&local_188,
                                 -iVar14,(int *)0x0);
                if (cVar7 == C1_continuous) {
                  ON_3dVector::operator-(&local_1d0,&local_170,&local_188);
                  dVar18 = ON_3dVector::MaximumCoordinate(&local_170);
                  bVar4 = ON_3dVector::IsTiny(&local_1d0,dVar18 * 1.490116119385e-08);
                  uVar15 = uVar15 & 0xff;
                  if (!bVar4) {
                    uVar15 = 1;
                  }
                }
                else {
                  local_158.z = local_170.z;
                  local_158.x = local_170.x;
                  local_158.y = local_170.y;
                  local_c8.x = local_188.x;
                  local_c8.y = local_188.y;
                  local_c8.z = local_188.z;
                  ON_3dVector::Unitize(&local_158);
                  ON_3dVector::Unitize(&local_c8);
                  dVar18 = ON_3dVector::operator*(&local_158,&local_c8);
                  if (dVar18 < cos_angle_tolerance) {
                    uVar15 = 1;
                  }
                }
                if ((dtype != (int *)0x0) && (iVar14 = 1, (char)uVar15 != '\0')) goto LAB_00592751;
              }
            }
            else {
              ON_Curve::Ev2Der((ON_Curve *)p,dVar18,&local_48,&local_170,&local_78,iVar14,(int *)0x0
                              );
              ON_Curve::Ev2Der((ON_Curve *)p_00,(double)local_1b8._0_8_,&local_60,&local_188,
                               &local_90,-iVar14,(int *)0x0);
              if (cVar7 == C2_continuous) {
                ON_3dVector::operator-(&local_1d0,&local_170,&local_188);
                dVar18 = ON_3dVector::MaximumCoordinate(&local_170);
                bVar4 = ON_3dVector::IsTiny(&local_1d0,dVar18 * 1.490116119385e-08);
                if (bVar4) {
                  ON_3dVector::operator-(&local_1d0,&local_78,&local_90);
                  dVar18 = ON_3dVector::MaximumCoordinate(&local_78);
                  bVar4 = ON_3dVector::IsTiny(&local_1d0,dVar18 * 1.490116119385e-08);
                  uVar15 = uVar15 & 0xff;
                  if (!bVar4) {
                    uVar15 = 1;
                  }
                  if (!bVar4 && dtype != (int *)0x0) {
                    uVar15 = 1;
                    iVar14 = 2;
                    goto LAB_00592751;
                  }
                  goto LAB_00592905;
                }
LAB_00592677:
                iVar14 = 1;
              }
              else {
                ON_EvCurvature(&local_170,&local_78,&local_158,&local_120);
                ON_EvCurvature(&local_188,&local_90,&local_c8,&local_138);
                dVar18 = ON_3dVector::operator*(&local_158,&local_c8);
                if (dVar18 < cos_angle_tolerance) goto LAB_00592677;
                if (cVar7 == Gsmooth_continuous) {
                  Km_00.y = local_120.y;
                  Km_00.x = local_120.x;
                  Km_00.z = local_120.z;
                  Kp_00.y = local_138.y;
                  Kp_00.x = local_138.x;
                  Kp_00.z = local_138.z;
                  bVar4 = ON_IsGsmoothCurvatureContinuous
                                    (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
                }
                else {
                  Km_01.y = local_120.y;
                  Km_01.x = local_120.x;
                  Km_01.z = local_120.z;
                  Kp_01.y = local_138.y;
                  Kp_01.x = local_138.x;
                  Kp_01.z = local_138.z;
                  bVar4 = ON_IsG2CurvatureContinuous
                                    (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
                }
                if (((bVar4 == true && cVar7 == Gsmooth_continuous) &&
                    (pOVar10 = ON_ArcCurve::Cast(p), pOVar10 != (ON_ArcCurve *)0x0)) &&
                   (pOVar11 = ON_ArcCurve::Cast(p_00), pOVar11 != (ON_ArcCurve *)0x0)) {
                  bVar5 = ON_ArcToArcTransitionIsNotGsmooth
                                    (&pOVar10->m_arc,&pOVar11->m_arc,cos_angle_tolerance,
                                     curvature_tolerance);
                  bVar4 = (bool)(bVar4 & !bVar5);
                }
                if (bVar4 != false) {
                  if (cVar7 == Gsmooth_continuous) {
                    this_00 = p;
                    if (t0 <= t1) {
                      this_00 = p_00;
                      p_00 = p;
                    }
                    bVar4 = ON_Curve::LastSpanIsLinear((ON_Curve *)p_00,1e-08,1e-08);
                    bVar5 = ON_Curve::FirstSpanIsLinear((ON_Curve *)this_00,1e-08,1e-08);
                    uVar15 = uVar15 & 0xff;
                    if (bVar5 != bVar4) {
                      uVar15 = 1;
                    }
                    if ((dtype != (int *)0x0) && (bVar5 != bVar4)) {
                      uVar15 = 1;
                      iVar14 = 3;
                      goto LAB_00592751;
                    }
                  }
                  goto LAB_00592905;
                }
                iVar14 = 2;
              }
              uVar15 = 1;
              if (dtype != (int *)0x0) {
LAB_00592751:
                *dtype = iVar14;
              }
            }
LAB_00592905:
            bVar4 = true;
            dVar18 = t0;
            if ((char)uVar15 != '\0') {
              lVar1 = lVar13 + 1;
              if (t1 < t0) {
                lVar1 = lVar13;
              }
              if (t != (double *)0x0) {
                *t = (this->m_t).m_a[(int)lVar1];
              }
              if (hint != (int *)0x0) {
                *hint = (int)lVar1;
              }
              goto LAB_00592950;
            }
            goto LAB_00592953;
          }
        }
        bVar4 = false;
      }
      else {
LAB_00592950:
        bVar4 = false;
      }
LAB_00592953:
      if ((!bVar4) || (uVar2 <= (int)local_1d8 + uVar8)) break;
      pdVar9 = (this->m_t).m_a;
      lVar1 = lVar13 * 8;
      lVar13 = lVar13 + local_190;
      if (*(double *)((long)pdVar9 + lVar1 + local_1e0 + 8) <= dVar21) break;
    }
  }
  else {
LAB_005929c0:
    uVar15 = 0;
  }
  bVar6 = (byte)uVar15;
  if ((cVar7 != local_1f4) && ((uVar15 & 1) == 0)) {
    bVar6 = ON_Curve::GetNextDiscontinuity
                      (&this->super_ON_Curve,local_1f4,t0,t1,t,(int *)0x0,dtype,cos_angle_tolerance,
                       curvature_tolerance);
  }
LAB_00592a09:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ON_PolyCurve::GetNextDiscontinuity( 
        ON::continuity c,
        double t0,
        double t1,
        double* t,
        int* hint,
        int* dtype,
        double cos_angle_tolerance,
        double curvature_tolerance
        ) const
{
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;
  double s0, s1, s;
  bool rc = false;
  ON_Interval sdom, cdom;
  const int count = Count();
  int segment_hint=0, curve_hint=0;
  if ( dtype )
    *dtype = 0;
  if ( count > 0 && t0 != t1 ) 
  {
    // 20 March 2003 Dale Lear:
    //     look for parametric discontinuities on the interior.
    //     If we don't find any, then well check for locus 
    //     discontinuities at the appropriate end
    ON::continuity input_c = c;
    c = ON::ParametricContinuity((int)c);

    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,(t0>t1)?-1:1,segment_hint);
    curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;


    {
      // 20 March 2003 Dale Lear:
      //     If t0 is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      double segtol = (fabs(m_t[segment_index]) + fabs(m_t[segment_index+1]) + fabs(m_t[segment_index+1]-m_t[segment_index]))*ON_SQRT_EPSILON;
      if ( m_t[segment_index]+segtol < m_t[segment_index+1]-segtol )
      {
        if ( t0 < t1 )
        {
          if ( t0 < m_t[segment_index+1] && t1 > m_t[segment_index+1] && fabs(t0-m_t[segment_index+1]) <= segtol && segment_index+1 < count )
          {
            t0 = m_t[segment_index+1];
            segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,1,segment_hint);
          }
        }
        else
        {
          if ( t0 > m_t[segment_index] && t1 < m_t[segment_index] && fabs(t0-m_t[segment_index]) <= segtol && segment_index > 0 )
          {
            t0 = m_t[segment_index];
          }
        }
      }
    }

    double tmin, tmax;
    int segment_index_delta;
    if (t0 > t1)
    {
      segment_index_delta = -1;
      tmin = t1;
      tmax = t0;
    }
    else
    {
      segment_index_delta = 1;
      tmin = t0;
      tmax = t1;
    }

    const ON_Curve* crv;
    for ( /*empty*/; 
              segment_index >= 0 
           && segment_index < count
           && tmin < m_t[segment_index+1] && m_t[segment_index] < tmax; 
          segment_index += segment_index_delta )
    {
      crv = m_segment[segment_index];
      if ( !crv )
        break;
      
      cdom = crv->Domain();
      sdom.Set( m_t[segment_index], m_t[segment_index+1] );
      s0 = sdom.TransformParameterTo(cdom, t0);
      s1 = sdom.TransformParameterTo(cdom, t1);
      rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
      if ( rc )
      {
        double kink_t;
        if ( sdom == cdom )
        {
          kink_t = s;
        }
        else
        {
          kink_t = cdom.TransformParameterTo(sdom, s);
          double t_tol = (fabs(t0)+fabs(t1)+fabs(t0-t1))*ON_ZERO_TOLERANCE;
          if ( kink_t <= tmin+t_tol || kink_t >= tmax-t_tol)
          {
            // 24 January 2002 Dale Lear -
            // It is possible that lost precision in the 
            // domain conversion is giving us trouble.
            // In particular, if this code is not here,
            // "t0" is right at a kink, and s0 gets bumped
            // down a little bit due to rounding/truncation,
            // we end up finding the kink at "t0" that we were
            // supposed to skip.
            double e = fabs(sdom.Length()/cdom.Length());
            if ( e < 1.0 ) e = 1.0; else if (e > 1000.0) e = 1000.0;
            double s_tol = (fabs(s0)+fabs(s1)+fabs(s0-s1))*ON_ZERO_TOLERANCE*e;
            if ( kink_t <= tmin+t_tol )
            {
              if( s0>s1 )
                s1 = s1 + s_tol;
              else
                s0 = s0 + s_tol;
            }
            if ( kink_t >= tmax-t_tol )
            {
              if ( s0>s1 )
                s0 = s0 - s_tol;
              else
                s1 = s1 - s_tol;
            }
            rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
            if (rc)
            {
              kink_t = cdom.TransformParameterTo(sdom, s);
              if ( kink_t <= tmin || kink_t >= tmax )
                rc = false;
            }
          }
        }

        if (rc)
        {
          if ( t )
          {
            *t = kink_t;
            if ( hint )
            {
              *hint = segment_index | (curve_hint<<14);
            }
          }
          break;
        }
      }


      // check for discontinuity between curve segments
      int next_segment_index = segment_index+segment_index_delta;
      if ( next_segment_index < 0 || next_segment_index >= count )
      {
        // no more curve segments in search interval
        break;
      }
      const ON_Curve* crv1 = m_segment[next_segment_index];
      if ( !crv1 )
        break;

      if ( t0 > t1 )
      {
        if ( sdom[0] <= t1 ) // this line is correct - search is decreasing towards t1
        {
          // INTERIOR of search interval does not include 
          // start this crv = end of next curve
          break;
        }
      }
      else
      {
        if ( t1 <= sdom[1] )
        {
          // INTERIOR of search interval does not include 
          // end of this crv = start of next curve
          break;
        }
      }

      double crv0_t, crv1_t;
      int crv0_side;
      if ( t0 > t1 )
      {
        // compare start if this curve against end of next curve
        crv0_t = cdom[0];
        crv1_t = crv1->Domain()[1];
        crv0_side = 1;
      }
      else
      {
        // compare end if this curve against start of next curve
        crv0_t = cdom[1];
        crv1_t = crv1->Domain()[0];
        crv0_side = -1;
      }

      switch( c )
      {
      case ON::continuity::C1_continuous:
      case ON::continuity::G1_continuous:
        crv->Ev1Der( crv0_t, Pm, D1m, crv0_side );   // point on this curve
        crv1->Ev1Der( crv1_t, Pp, D1p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C1_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
            rc = true;
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
          if ( Tm*Tp < cos_angle_tolerance )
            rc = true;
        }
        if ( rc && dtype )
          *dtype = 1;
        break;

      case ON::continuity::C2_continuous:
      case ON::continuity::G2_continuous:
      case ON::continuity::Gsmooth_continuous:
        crv->Ev2Der( crv0_t, Pm, D1m, D2m, crv0_side );   // point on this curve
        crv1->Ev2Der( crv1_t, Pp, D1p, D2p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C2_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) ) 
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            rc = true;
            if ( dtype )
              *dtype = 2;
          }
        }
        else
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
          if ( Tm*Tp < cos_angle_tolerance )
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else 
          {
            bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
              ? ON_IsGsmoothCurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance)
              : ON_IsG2CurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance);
            if ( bIsCurvatureContinuous &&  ON::continuity::Gsmooth_continuous == c )
            {
              // This fixex http://dev.mcneel.com/bugtrack/?q=116273
              const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(crv);
              if ( 0 != arc0 )
              {
                const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(crv1);
                if ( 0 != arc1 )
                {
                  // 6 November, 2012 Dale Lear
                  //   Fix bug 116273
                  //   by breaking when adjacent, tangent coplanar arcs
                  //   are visually different.
                  if ( ON_ArcToArcTransitionIsNotGsmooth(arc0->m_arc,arc1->m_arc, cos_angle_tolerance, curvature_tolerance ) )
                    bIsCurvatureContinuous = false;
                }
              }
            }
            if ( !bIsCurvatureContinuous )
            {
              // NOTE:
              //   The test to enter this scope must exactly match
              //   the one used in ON_NurbsCurve::GetNextDiscontinuity().
              rc = true;
              if ( dtype )
                *dtype = 2;
            }
            else if ( ON::continuity::Gsmooth_continuous == c )
            {
              const double is_linear_tolerance = 1.0e-8;  
              const double is_linear_min_length = 1.0e-8;
              const ON_Curve* seg0;
              const ON_Curve* seg1;
              if (crv0_side<0)
              {
                seg0 = crv;
                seg1 = crv1;
              }
              else
              {
                seg0 = crv1;
                seg1 = crv;
              }
              bool b0 = seg0->LastSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              bool b1 = seg1->FirstSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              if ( b0 != b1 )
              {
                rc = true;
                if ( dtype )
                  *dtype = 3;
              }
            }
          }
        }
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
      if (rc)
      {
        int tindex = (t0>t1)?segment_index:(segment_index+1); 
        if ( t )
          *t = m_t[tindex];
        if ( hint )
        {
          *hint = tindex;
        }
        break;
      }
    }

    if ( !rc && input_c != c )
    {
      // 20 March 2003 Dale Lear
      //   See if we need to do a locus check at an end
      rc = ON_Curve::GetNextDiscontinuity( input_c, 
                        t0, t1, t, nullptr, 
                        dtype, 
                        cos_angle_tolerance, curvature_tolerance );
    }
  }
  return rc;
}